

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::insert_move(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,Node *keyval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint8_t *puVar2;
  byte bVar3;
  FuncDefinition *pFVar4;
  FuncDefinition *__ptr;
  pointer pcVar5;
  undefined8 uVar6;
  bool bVar7;
  size_t sVar8;
  uint8_t *puVar9;
  long lVar10;
  string *this_00;
  uint uVar11;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar7 = try_increase_info(this);
    if (!bVar7) {
      throwOverflowError(this);
    }
  }
  sVar8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               keyval);
  uVar11 = ((uint)sVar8 & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f);
  sVar8 = sVar8 >> 5 & this->mMask;
  puVar9 = this->mInfo;
  bVar3 = puVar9[sVar8];
  while (uVar11 = uVar11 + this->mInfoInc, uVar11 <= bVar3) {
    lVar10 = sVar8 + 1;
    sVar8 = sVar8 + 1;
    bVar3 = puVar9[lVar10];
  }
  if (0xff < (uVar11 & 0xff) + this->mInfoInc) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar10 = 1;
  do {
    lVar10 = lVar10 + -1;
    puVar2 = puVar9 + sVar8;
    puVar9 = puVar9 + 1;
  } while (*puVar2 != '\0');
  this_00 = (string *)(this->mKeyVals + sVar8);
  if (lVar10 == 0) {
    *(string **)this_00 = this_00 + 0x10;
    pcVar5 = (keyval->mData).first._M_dataplus._M_p;
    paVar1 = &(keyval->mData).first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 == paVar1) {
      uVar6 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
      *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
      *(undefined8 *)(this_00 + 0x18) = uVar6;
    }
    else {
      *(pointer *)this_00 = pcVar5;
      *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
    }
    *(size_type *)(this_00 + 8) = (keyval->mData).first._M_string_length;
    (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
    (keyval->mData).first._M_string_length = 0;
    (keyval->mData).first.field_2._M_local_buf[0] = '\0';
    *(FuncDefinition **)(this_00 + 0x20) =
         (keyval->mData).second._M_t.
         super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>._M_t.
         super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
         super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl;
    (keyval->mData).second._M_t.
    super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>._M_t.
    super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
    super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl = (FuncDefinition *)0x0;
  }
  else {
    shiftUp(this,sVar8 - lVar10,sVar8);
    std::__cxx11::string::operator=(this_00,(string *)keyval);
    pFVar4 = (keyval->mData).second._M_t.
             super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>
             .super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl;
    (keyval->mData).second._M_t.
    super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>._M_t.
    super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
    super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl = (FuncDefinition *)0x0;
    __ptr = *(FuncDefinition **)(this_00 + 0x20);
    *(FuncDefinition **)(this_00 + 0x20) = pFVar4;
    if (__ptr != (FuncDefinition *)0x0) {
      std::default_delete<Rml::FuncDefinition>::operator()
                ((default_delete<Rml::FuncDefinition> *)(this_00 + 0x20),__ptr);
    }
  }
  this->mInfo[sVar8] = (uint8_t)uVar11;
  this->mNumElements = this->mNumElements + 1;
  return sVar8;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }